

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WScriptJsrt.h
# Opt level: O2

LPCWSTR WScriptJsrt::ConvertErrorCodeToMessage(JsErrorCode errorCode)

{
  code *pcVar1;
  PAL_FILE *pPVar2;
  
  switch(errorCode) {
  case JsErrorInvalidArgument:
    return L"TypeError: InvalidArgument";
  case JsErrorNullArgument:
    return L"TypeError: NullArgument";
  case JsErrorNoCurrentContext:
  case JsErrorNotImplemented:
  case JsErrorWrongThread:
  case JsErrorRuntimeInUse:
  case JsErrorInDisabledState:
  case JsErrorCannotDisableExecution:
  case JsErrorHeapEnumInProgress:
    goto switchD_00112823_caseD_10003;
  case JsErrorInExceptionState:
    return L"ErrorInExceptionState";
  case JsErrorBadSerializedScript:
    return L"ErrorBadSerializedScript ";
  case JsErrorArgumentNotObject:
    return L"TypeError: ArgumentNotAnObject";
  default:
    if (errorCode == JsErrorOutOfMemory) {
      return L"OutOfMemory";
    }
    if (errorCode == JsErrorScriptException) {
      return L"ScriptError";
    }
    if (errorCode == JsErrorScriptCompile) {
      return L"SyntaxError";
    }
    if (errorCode == JsErrorFatal) {
      return L"FatalError";
    }
switchD_00112823_caseD_10003:
    pPVar2 = PAL_get_stderr(0);
    PAL_fprintf(pPVar2,"ASSERTION (%s, line %d) %s %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/bin/ch/WScriptJsrt.h"
                ,0x61,"false","Unexpected JsErrorCode");
    pPVar2 = PAL_get_stderr(0);
    PAL_fflush(pPVar2);
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
}

Assistant:

static LPCWSTR ConvertErrorCodeToMessage(JsErrorCode errorCode)
    {
        switch (errorCode)
        {
        case (JsErrorCode::JsErrorInvalidArgument) :
            return _u("TypeError: InvalidArgument");
        case (JsErrorCode::JsErrorNullArgument) :
            return _u("TypeError: NullArgument");
        case (JsErrorCode::JsErrorArgumentNotObject) :
            return _u("TypeError: ArgumentNotAnObject");
        case (JsErrorCode::JsErrorOutOfMemory) :
            return _u("OutOfMemory");
        case (JsErrorCode::JsErrorScriptException) :
            return _u("ScriptError");
        case (JsErrorCode::JsErrorScriptCompile) :
            return _u("SyntaxError");
        case (JsErrorCode::JsErrorFatal) :
            return _u("FatalError");
        case (JsErrorCode::JsErrorInExceptionState) :
            return _u("ErrorInExceptionState");
        case (JsErrorCode::JsErrorBadSerializedScript):
            return _u("ErrorBadSerializedScript ");
        default:
            AssertMsg(false, "Unexpected JsErrorCode");
            return nullptr;
        }
    }